

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int rede_add_entry(file_info *file)

{
  bool bVar1;
  file_info *local_20;
  file_info *re;
  file_info *file_local;
  
  local_20 = file->parent;
  while( true ) {
    bVar1 = false;
    if (local_20 != (file_info *)0x0) {
      bVar1 = local_20->re == '\0';
    }
    if (!bVar1) break;
    local_20 = local_20->parent;
  }
  if (local_20 == (file_info *)0x0) {
    file_local._4_4_ = -1;
  }
  else {
    file->re_next = (file_info *)0x0;
    *(local_20->rede_files).last = file;
    (local_20->rede_files).last = &file->re_next;
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

static inline int
rede_add_entry(struct file_info *file)
{
	struct file_info *re;

	/*
	 * Find "RE" entry.
	 */
	re = file->parent;
	while (re != NULL && !re->re)
		re = re->parent;
	if (re == NULL)
		return (-1);

	file->re_next = NULL;
	*re->rede_files.last = file;
	re->rede_files.last = &(file->re_next);
	return (0);
}